

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBeginException(WatWriter *this,Exception *except)

{
  string_view local_28;
  Exception *local_18;
  Exception *except_local;
  WatWriter *this_local;
  
  local_18 = except;
  except_local = (Exception *)this;
  WriteOpenSpace(this,"except");
  string_view::string_view(&local_28,&local_18->name);
  WriteNameOrIndex(this,local_28,this->except_index_,Space);
  WriteInlineExports(this,Except,this->except_index_);
  WriteInlineImport(this,Except,this->except_index_);
  WriteTypes(this,&local_18->sig,(char *)0x0);
  this->except_index_ = this->except_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteBeginException(const Exception& except) {
  WriteOpenSpace("except");
  WriteNameOrIndex(except.name, except_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Except, except_index_);
  WriteInlineImport(ExternalKind::Except, except_index_);
  WriteTypes(except.sig, nullptr);
  ++except_index_;
}